

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamWriterPrivate::SaveAlignment(BamWriterPrivate *this,BamAlignment *al)

{
  long in_RSI;
  BamException *e;
  BamWriterPrivate *in_stack_00000030;
  BamAlignment *in_stack_00000298;
  BamWriterPrivate *in_stack_000002a0;
  
  if ((*(byte *)(in_RSI + 0x130) & 1) == 0) {
    WriteAlignment(in_stack_000002a0,in_stack_00000298);
  }
  else {
    WriteCoreAlignment(in_stack_00000030,(BamAlignment *)this);
  }
  return true;
}

Assistant:

bool BamWriterPrivate::SaveAlignment(const BamAlignment& al)
{

    try {

        // if BamAlignment contains only the core data and a raw char data buffer
        // (as a result of BamReader::GetNextAlignmentCore())
        if (al.SupportData.HasCoreOnly) {
            WriteCoreAlignment(al);

            // otherwise, BamAlignment should contain character in the standard fields: Name, QueryBases, etc
            // (resulting from BamReader::GetNextAlignment() *OR* being generated directly by client code)
        } else {
            WriteAlignment(al);
        }

        // if we get here, everything OK
        return true;

    } catch (const BamException& e) {
        m_errorString = e.what();
        return false;
    }
}